

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

int Abc_AigLevel(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x128,"int Abc_AigLevel(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs != 0) {
    iVar1 = Abc_NtkLevel(pNtk);
    return iVar1;
  }
  uVar4 = 0;
  for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
    plVar3 = (long *)Vec_PtrEntry(pNtk->vCos,iVar1);
    uVar2 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)plVar3[4] * 8) + 0x14) >> 0xc;
    if (uVar4 <= uVar2) {
      uVar4 = uVar2;
    }
  }
  return uVar4;
}

Assistant:

int Abc_AigLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( pNtk->nBarBufs )
        return Abc_NtkLevel( pNtk );
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( LevelsMax < (int)Abc_ObjFanin0(pNode)->Level )
            LevelsMax = (int)Abc_ObjFanin0(pNode)->Level;
    return LevelsMax;
}